

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_hd.c
# Opt level: O3

void hd_context_free(nghttp2_hd_context *context)

{
  nghttp2_mem *mem;
  nghttp2_hd_entry *ptr;
  size_t idx;
  
  mem = context->mem;
  if ((context->hd_table).len != 0) {
    idx = 0;
    do {
      ptr = hd_ringbuf_get(&context->hd_table,idx);
      nghttp2_rcbuf_decref((ptr->nv).value);
      nghttp2_rcbuf_decref((ptr->nv).name);
      nghttp2_mem_free(mem,ptr);
      idx = idx + 1;
    } while (idx < (context->hd_table).len);
  }
  nghttp2_mem_free(mem,(context->hd_table).buffer);
  return;
}

Assistant:

static void hd_context_free(nghttp2_hd_context *context) {
  hd_ringbuf_free(&context->hd_table, context->mem);
}